

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher
          (Matcher<std::optional<solitaire::cards::Card>_&> *this,
          optional<solitaire::cards::Card> *value)

{
  bool bVar1;
  _Storage<solitaire::cards::Card,_true> _Var2;
  MatcherBase<std::optional<solitaire::cards::Card>_&> local_38;
  
  (this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>).super_MatcherDescriberInterface
  ._vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00321a28;
  _Var2 = (value->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
          super__Optional_payload_base<solitaire::cards::Card>._M_payload;
  bVar1 = (value->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
          super__Optional_payload_base<solitaire::cards::Card>._M_engaged;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00321a98;
  local_38.vtable_ =
       (VTable *)
       internal::MatcherBase<std::optional<solitaire::cards::Card>&>::
       GetVTable<testing::internal::MatcherBase<std::optional<solitaire::cards::Card>&>::ValuePolicy<testing::internal::EqMatcher<std::optional<solitaire::cards::Card>>,false>>()
       ::kVTable;
  local_38.buffer_.ptr = operator_new(0x10);
  ((local_38.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(_Storage<solitaire::cards::Card,_true> *)(local_38.buffer_.i + 4) = _Var2;
  *(bool *)(local_38.buffer_.i + 0xc) = bVar1;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00321a28;
  internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::operator=
            (&this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>,&local_38);
  internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }